

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O1

ChildrenAnswers * __thiscall
CPrintVisitor::VisitChildren
          (ChildrenAnswers *__return_storage_ptr__,CPrintVisitor *this,
          vector<INode_*,_std::allocator<INode_*>_> *children)

{
  INode *pIVar1;
  pointer pcVar2;
  pointer ppIVar3;
  ulong uVar4;
  string local_50;
  
  (__return_storage_ptr__->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppIVar3 = (children->super__Vector_base<INode_*,_std::allocator<INode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((children->super__Vector_base<INode_*,_std::allocator<INode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppIVar3) {
    uVar4 = 0;
    do {
      pIVar1 = ppIVar3[uVar4];
      if (pIVar1 != (INode *)0x0) {
        (**pIVar1->_vptr_INode)(pIVar1,this);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = (this->description)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + (this->description)._M_string_length);
        ChildrenAnswers::PushBack
                  ((ChildrenAnswers *)__return_storage_ptr__,&local_50,this->lastVisited);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&this->description,0,(char *)(this->description)._M_string_length,0x15c41a
                  );
      }
      uVar4 = uVar4 + 1;
      ppIVar3 = (children->super__Vector_base<INode_*,_std::allocator<INode_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(children->super__Vector_base<INode_*,_std::allocator<INode_*>_>)
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3 >> 3))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ChildrenAnswers CPrintVisitor::VisitChildren(std::vector<INode*> children) {
	ChildrenAnswers answers = ChildrenAnswers();
	for (int i = 0; i < children.size(); i++) {
		if ( children[i] ) {
			children[i]->Accept(*this);
			answers.PushBack(this->description, lastVisited);
			this->description = "";
		}
	}
	return answers;
}